

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extent.c
# Opt level: O2

_Bool extent_register_impl(tsdn_t *tsdn,pac_t *pac,edata_t *edata,_Bool gdump_add)

{
  _Bool _Var1;
  
  _Var1 = duckdb_je_emap_register_boundary(tsdn,pac->emap,edata,0xe8,false);
  return _Var1;
}

Assistant:

static bool
extent_register_impl(tsdn_t *tsdn, pac_t *pac, edata_t *edata, bool gdump_add) {
	assert(edata_state_get(edata) == extent_state_active);
	/*
	 * No locking needed, as the edata must be in active state, which
	 * prevents other threads from accessing the edata.
	 */
	if (emap_register_boundary(tsdn, pac->emap, edata, SC_NSIZES,
	    /* slab */ false)) {
		return true;
	}

	if (config_prof && gdump_add) {
		extent_gdump_add(tsdn, edata);
	}

	return false;
}